

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O0

void coins_tests::CheckWriteCoins
               (CAmount parent_value,CAmount child_value,CAmount expected_value,char parent_flags,
               char child_flags,char expected_flags)

{
  bool bVar1;
  undefined4 in_ECX;
  CAmount in_RDX;
  CAmount in_RSI;
  long in_FS_OFFSET;
  logic_error *anon_var_0;
  char result_flags;
  CAmount result_value;
  SingleEntryCacheTest test;
  char *in_stack_fffffffffffffaf8;
  lazy_ostream *in_stack_fffffffffffffb00;
  char *in_stack_fffffffffffffb08;
  lazy_ostream *in_stack_fffffffffffffb20;
  size_t in_stack_fffffffffffffb28;
  size_t line_num;
  undefined7 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb37;
  lazy_ostream *in_stack_fffffffffffffb38;
  SingleEntryCacheTest *in_stack_fffffffffffffb68;
  undefined1 local_460 [7];
  undefined1 in_stack_fffffffffffffba7;
  CCoinsViewCacheTest *in_stack_fffffffffffffba8;
  undefined1 local_450 [64];
  undefined1 local_410 [16];
  undefined1 local_400 [71];
  undefined1 local_3b9;
  undefined1 local_3b8 [15];
  undefined1 local_3a9 [929];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  SingleEntryCacheTest::SingleEntryCacheTest
            (in_stack_fffffffffffffb68,in_RSI,in_RDX,(char)((uint)in_ECX >> 0x18));
  WriteCoinsViewEntry(&in_stack_fffffffffffffb68->root,in_RSI,(char)((ulong)in_RDX >> 0x38));
  anon_unknown.dwarf_34a75b::CCoinsViewCacheTest::SelfTest
            (in_stack_fffffffffffffba8,(bool)in_stack_fffffffffffffba7);
  anon_unknown.dwarf_34a75b::CCoinsViewCacheTest::map
            ((CCoinsViewCacheTest *)in_stack_fffffffffffffaf8);
  GetCoinsMapEntry((CCoinsMap *)in_stack_fffffffffffffb08,(CAmount *)in_stack_fffffffffffffb00,
                   in_stack_fffffffffffffaf8,(COutPoint *)0x50f4f5);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
               (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffb38,
               (const_string *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb28,(const_string *)in_stack_fffffffffffffb20);
    in_stack_fffffffffffffb38 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffb00,(char (*) [1])in_stack_fffffffffffffaf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
               (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
    in_stack_fffffffffffffb08 = "expected_value";
    in_stack_fffffffffffffb00 = (lazy_ostream *)(local_3a9 + 1);
    in_stack_fffffffffffffaf8 = "result_value";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_400,local_410,0x33d,1,2,local_3b8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffaf8);
    in_stack_fffffffffffffb37 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffb37);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
               (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffaf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffb38,
               (const_string *)CONCAT17(in_stack_fffffffffffffb37,in_stack_fffffffffffffb30),
               line_num,(const_string *)in_stack_fffffffffffffb20);
    in_stack_fffffffffffffb20 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffb00,(char (*) [1])in_stack_fffffffffffffaf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffb08,
               (pointer)in_stack_fffffffffffffb00,(unsigned_long)in_stack_fffffffffffffaf8);
    in_stack_fffffffffffffb08 = "expected_flags";
    in_stack_fffffffffffffb00 = (lazy_ostream *)local_3a9;
    in_stack_fffffffffffffaf8 = "result_flags";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
              (local_450,local_460,0x33e,1,2,&local_3b9);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffaf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  SingleEntryCacheTest::~SingleEntryCacheTest((SingleEntryCacheTest *)in_stack_fffffffffffffaf8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CheckWriteCoins(CAmount parent_value, CAmount child_value, CAmount expected_value, char parent_flags, char child_flags, char expected_flags)
{
    SingleEntryCacheTest test(ABSENT, parent_value, parent_flags);

    CAmount result_value;
    char result_flags;
    try {
        WriteCoinsViewEntry(test.cache, child_value, child_flags);
        test.cache.SelfTest(/*sanity_check=*/false);
        GetCoinsMapEntry(test.cache.map(), result_value, result_flags);
    } catch (std::logic_error&) {
        result_value = FAIL;
        result_flags = NO_ENTRY;
    }

    BOOST_CHECK_EQUAL(result_value, expected_value);
    BOOST_CHECK_EQUAL(result_flags, expected_flags);
}